

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O3

void __thiscall
Rml::ElementScroll::EnableScrollbar(ElementScroll *this,Orientation orientation,float element_width)

{
  Element *this_00;
  Vector2f VVar1;
  ComputedValues *pCVar2;
  Scrollbar *pSVar3;
  float fVar4;
  float fVar5;
  Box box;
  Property local_88;
  float local_38;
  
  pSVar3 = this->scrollbars + orientation;
  if (this->scrollbars[orientation].enabled == false) {
    CreateScrollbar(this,orientation);
    this_00 = pSVar3->element;
    local_88.value.type = NONE;
    Variant::Set(&local_88.value,0);
    local_88.unit = KEYWORD;
    local_88.specificity = -1;
    local_88.definition = (PropertyDefinition *)0x0;
    local_88.parser_index = -1;
    local_88.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_88.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(this_00,Visibility,&local_88);
    if (local_88.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_88.value);
    this->scrollbars[orientation].enabled = true;
  }
  Box::Box((Box *)&local_88);
  VVar1.y = element_width;
  VVar1.x = element_width;
  LayoutDetails::BuildBox((Box *)&local_88,VVar1,pSVar3->element,Block);
  if (orientation == HORIZONTAL) {
    VVar1 = Box::GetSize((Box *)&local_88);
    if (0.0 <= VVar1.y) {
      VVar1 = Box::GetSize((Box *)&local_88,Margin);
      fVar5 = VVar1.y;
    }
    else {
      local_38 = Box::GetCumulativeEdge((Box *)&local_88,Content,Left);
      fVar4 = Box::GetCumulativeEdge((Box *)&local_88,Content,Right);
      pCVar2 = Element::GetComputedValues(pSVar3->element);
      fVar5 = ResolveValueOr((LengthPercentageAuto)
                             (CONCAT44((pCVar2->common).height_value,
                                       *(uint *)&pCVar2->common >> 0x13) & 0xffffffff00000003),
                             element_width,0.0);
      fVar5 = local_38 + fVar4 + fVar5;
    }
  }
  else {
    if (orientation != VERTICAL) goto LAB_0022c002;
    VVar1 = Box::GetSize((Box *)&local_88,Margin);
    fVar5 = VVar1.x;
  }
  this->scrollbars[orientation].size = fVar5;
LAB_0022c002:
  Box::~Box((Box *)&local_88);
  return;
}

Assistant:

void ElementScroll::EnableScrollbar(Orientation orientation, float element_width)
{
	if (!scrollbars[orientation].enabled)
	{
		CreateScrollbar(orientation);
		scrollbars[orientation].element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
		scrollbars[orientation].enabled = true;
	}

	// Determine the size of the scrollbar.
	Box box;
	LayoutDetails::BuildBox(box, Vector2f(element_width, element_width), scrollbars[orientation].element);

	if (orientation == VERTICAL)
		scrollbars[orientation].size = box.GetSize(BoxArea::Margin).x;
	if (orientation == HORIZONTAL)
	{
		if (box.GetSize().y < 0)
			scrollbars[orientation].size = box.GetCumulativeEdge(BoxArea::Content, BoxEdge::Left) +
				box.GetCumulativeEdge(BoxArea::Content, BoxEdge::Right) +
				ResolveValue(scrollbars[orientation].element->GetComputedValues().height(), element_width);
		else
			scrollbars[orientation].size = box.GetSize(BoxArea::Margin).y;
	}
}